

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

void __thiscall
QSequentialAnimationGroupPrivate::rewindForwards
          (QSequentialAnimationGroupPrivate *this,AnimationIndex *newAnimationIndex)

{
  parameter_type pVar1;
  int iVar2;
  qsizetype qVar3;
  const_reference ppQVar4;
  int *in_RSI;
  QList<QAbstractAnimation_*> *in_RDI;
  QAbstractAnimation *anim_1;
  int i_1;
  QAbstractAnimation *anim;
  int i;
  qsizetype in_stack_ffffffffffffffb8;
  undefined1 intermediate;
  QSequentialAnimationGroupPrivate *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffec;
  QList<QAbstractAnimation_*> *this_00;
  
  iVar2 = *(int *)&in_RDI[9].d.ptr;
  this_00 = in_RDI;
  pVar1 = ::QObjectCompatProperty::operator_cast_to_int
                    ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                      *)0x68a462);
  if (pVar1 < iVar2) {
    for (in_stack_ffffffffffffffec = *(int *)&in_RDI[8].d.d;
        intermediate = (undefined1)((uint)iVar2 >> 0x18), -1 < in_stack_ffffffffffffffec;
        in_stack_ffffffffffffffec = in_stack_ffffffffffffffec + -1) {
      QList<QAbstractAnimation_*>::at(in_RDI,in_stack_ffffffffffffffb8);
      setCurrentAnimation((QSequentialAnimationGroupPrivate *)
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          in_stack_ffffffffffffffec,
                          SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x38,0));
      QAbstractAnimation::setCurrentTime((QAbstractAnimation *)this_00,anim_1._4_4_);
    }
    qVar3 = QList<QAbstractAnimation_*>::size((QList<QAbstractAnimation_*> *)&in_RDI[6].d.size);
    if (qVar3 == 1) {
      activateCurrentAnimation(in_stack_ffffffffffffffd0,(bool)intermediate);
    }
    else {
      QList<QAbstractAnimation_*>::size((QList<QAbstractAnimation_*> *)&in_RDI[6].d.size);
      setCurrentAnimation((QSequentialAnimationGroupPrivate *)
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          in_stack_ffffffffffffffec,
                          SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x38,0));
    }
  }
  for (iVar2 = *(int *)&in_RDI[8].d.d; *in_RSI < iVar2; iVar2 = iVar2 + -1) {
    ppQVar4 = QList<QAbstractAnimation_*>::at(in_RDI,in_stack_ffffffffffffffb8);
    setCurrentAnimation((QSequentialAnimationGroupPrivate *)
                        CONCAT44(iVar2,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffec,
                        SUB81((ulong)*ppQVar4 >> 0x38,0));
    QAbstractAnimation::setCurrentTime((QAbstractAnimation *)this_00,anim_1._4_4_);
  }
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::rewindForwards(const AnimationIndex &newAnimationIndex)
{
    if (lastLoop > currentLoop) {
        // we need to fast rewind to the beginning
        for (int i = currentAnimationIndex; i >= 0 ; --i) {
            QAbstractAnimation *anim = animations.at(i);
            setCurrentAnimation(i, true);
            anim->setCurrentTime(0);
        }
        // this will make sure the current animation is reset to the end
        if (animations.size() == 1)
            // we need to force activation because setCurrentAnimation will have no effect
            activateCurrentAnimation();
        else
            setCurrentAnimation(animations.size() - 1, true);
    }

    // and now we need to fast rewind from the current position to
    for (int i = currentAnimationIndex; i > newAnimationIndex.index; --i) {
        QAbstractAnimation *anim = animations.at(i);
        setCurrentAnimation(i, true);
        anim->setCurrentTime(0);
    }
    // setting the new current animation will happen later
}